

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TempInputScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format,
               void *p_clamp_min,void *p_clamp_max)

{
  size_t __n;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  char *p_data_00;
  ImGuiInputTextFlags flags;
  char fmt_buf [32];
  undefined1 local_80 [8];
  ImGui local_78 [32];
  char local_58 [40];
  
  pIVar1 = GImGui;
  p_data_00 = ImParseFormatTrimDecorations(format,local_58,0x20);
  DataTypeFormatString(local_78,(char *)0x20,data_type,(ImGuiDataType)p_data,p_data_00,format);
  ImStrTrimBlanks((char *)local_78);
  flags = 0x200011;
  if ((data_type & 0xfffffffeU) == 8) {
    flags = 0x220010;
  }
  bVar2 = TempInputText(bb,id,label,(char *)local_78,0x20,flags);
  if (bVar2) {
    if (9 < (uint)data_type) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x6c4,"DataTypeGetInfo","ImGui ASSERT FAILED: %s");
    }
    __n = GDataTypeInfo[data_type].Size;
    memcpy(local_80,p_data,__n);
    DataTypeApplyOpFromText
              ((char *)local_78,(pIVar1->InputTextState).InitialTextA.Data,data_type,p_data,
               (char *)0x0);
    if (p_clamp_max != (void *)0x0 && p_clamp_min != (void *)0x0) {
      DataTypeClamp(data_type,p_data,p_clamp_min,p_clamp_max);
    }
    iVar3 = bcmp(local_80,p_data,__n);
    bVar2 = iVar3 != 0;
    if (bVar2) {
      MarkItemEdited(id);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::TempInputScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format, const void* p_clamp_min, const void* p_clamp_max)
{
    ImGuiContext& g = *GImGui;

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = false;
    if (TempInputText(bb, id, label, data_buf, IM_ARRAYSIZE(data_buf), flags))
    {
        // Backup old value
        size_t data_type_size = DataTypeGetInfo(data_type)->Size;
        ImGuiDataTypeTempStorage data_backup;
        memcpy(&data_backup, p_data, data_type_size);

        // Apply new value (or operations) then clamp
        DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialTextA.Data, data_type, p_data, NULL);
        if (p_clamp_min && p_clamp_max)
            DataTypeClamp(data_type, p_data, p_clamp_min, p_clamp_max);

        // Only mark as edited if new value is different
        value_changed = memcmp(&data_backup, p_data, data_type_size) != 0;
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}